

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int request_contains_shutdown_token(http_s *request)

{
  int *piVar1;
  char *__s1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  FIOBJ key;
  FIOBJ FVar5;
  char *__s2;
  uintptr_t uVar6;
  char cVar7;
  fiobj_object_vtable_s *pfVar8;
  uint uVar9;
  uint uVar10;
  undefined1 *puVar11;
  fio_str_info_s ret;
  fio_str_info_s local_38;
  
  iVar4 = http_parse_body(request);
  if (iVar4 != 0) {
    return 0;
  }
  key = fiobj_str_new("token",5);
  uVar9 = 0;
  if ((((uint)request->params & 7) != 4) ||
     (FVar5 = fiobj_hash_get(request->params,key), FVar5 == 0)) goto LAB_0010537b;
  FVar5 = fiobj_hash_get(request->params,key);
  if (FVar5 == 0) {
LAB_001052a7:
    local_38.data = anon_var_dwarf_1dd;
    local_38.len._0_4_ = 4;
    goto LAB_001052ba;
  }
  if ((FVar5 & 1) == 0) {
    uVar9 = (uint)FVar5 & 6;
    cVar7 = '(';
    switch(uVar9) {
    case 0:
switchD_00105276_caseD_0:
      cVar7 = *(char *)(FVar5 & 0xfffffffffffffff8);
      break;
    case 4:
switchD_00105276_caseD_4:
      cVar7 = '*';
      break;
    case 6:
      if ((char)FVar5 == '&') {
        local_38.data = anon_var_dwarf_1e8;
        local_38.len._0_4_ = 5;
      }
      else {
        uVar10 = (uint)FVar5 & 0xff;
        if (uVar10 != 0x16) {
          if (uVar10 == 6) goto LAB_001052a7;
          switch(uVar9) {
          case 0:
            goto switchD_00105276_caseD_0;
          case 4:
            goto switchD_00105276_caseD_4;
          case 6:
            cVar7 = (char)FVar5;
          }
          break;
        }
        local_38.data = anon_var_dwarf_1f3;
        local_38.len._0_4_ = 4;
      }
LAB_001052ba:
      local_38.capa._0_4_ = 0;
      local_38.capa._4_4_ = 0;
      local_38.len._4_4_ = 0;
      goto LAB_00105357;
    }
    switch(cVar7) {
    case '\'':
      pfVar8 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar8 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar8 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar8 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar8 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar8 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar8->to_str)(&local_38,FVar5);
  }
  else {
    fio_ltocstr(&local_38,(long)FVar5 >> 1);
  }
LAB_00105357:
  __s1 = local_38.data;
  __s2 = getenv("RSHUTDOWN_TOKEN");
  iVar4 = strcmp(__s1,__s2);
  uVar9 = (uint)(iVar4 == 0);
LAB_0010537b:
  if ((((key & 1) == 0) && (key != 0)) && (uVar10 = (uint)key & 6, uVar10 != 6)) {
    puVar11 = (undefined1 *)(key & 0xfffffffffffffff8);
    LOCK();
    piVar1 = (int *)(puVar11 + 4);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      switch(uVar10) {
      case 0:
        uVar2 = *puVar11;
        break;
      case 2:
        uVar2 = 0x28;
        break;
      case 4:
        uVar2 = 0x2a;
      }
      switch(uVar2) {
      case 0x27:
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      uVar2 = (undefined1)key;
      if (pfVar8->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
        switch(uVar10) {
        case 0:
          uVar3 = *puVar11;
          break;
        case 2:
          uVar3 = 0x28;
          break;
        case 4:
          uVar3 = 0x2a;
          break;
        case 6:
          uVar3 = uVar2;
        }
        switch(uVar3) {
        case 0x27:
          pfVar8 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          pfVar8 = &FIOBJECT_VTABLE_STRING;
          break;
        case 0x29:
          pfVar8 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          pfVar8 = &FIOBJECT_VTABLE_HASH;
          break;
        case 0x2b:
          pfVar8 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar8 = &FIOBJECT_VTABLE_NUMBER;
        }
        uVar6 = (*pfVar8->count)(key);
        if (uVar6 != 0) {
          fiobj_free_complex_object(key);
          return uVar9;
        }
      }
      switch(uVar10) {
      case 0:
        uVar2 = *puVar11;
        break;
      case 2:
        uVar2 = 0x28;
        break;
      case 4:
        uVar2 = 0x2a;
        break;
      case 6:
      }
      switch(uVar2) {
      case 0x27:
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar8->dealloc)(key,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
    }
  }
  return uVar9;
}

Assistant:

int request_contains_shutdown_token(http_s *request) {
  int contains_shutdown_token = 0;

  if (http_parse_body(request) != 0) {
    return 0;
  }

  FIOBJ key = fiobj_str_new("token", 5);
  if (
    FIOBJ_TYPE_IS(request->params, FIOBJ_T_HASH)  /* check if JSON object is a hash, */
    && fiobj_hash_get(request->params, key)  /* test for existence of "token", */
    && !strcmp(fiobj_obj2cstr(fiobj_hash_get(request->params, key)).data,
        getenv("RSHUTDOWN_TOKEN"))  /* and test if token matches RSHUTDOWN_TOKEN */
  ) {
    contains_shutdown_token = 1;
  }
  fiobj_free(key);

  return contains_shutdown_token;
}